

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LParser.cpp
# Opt level: O0

void __thiscall
LNodeEStmt::LNodeEStmt(LNodeEStmt *this,shared_ptr<LNode> *vars,shared_ptr<LNode> *expr)

{
  shared_ptr<LNode> *expr_local;
  shared_ptr<LNode> *vars_local;
  LNodeEStmt *this_local;
  
  std::shared_ptr<LNode>::shared_ptr(&this->vars);
  std::shared_ptr<LNode>::shared_ptr(&this->expr);
  std::shared_ptr<LNode>::operator=(&this->vars,vars);
  std::shared_ptr<LNode>::operator=(&this->expr,expr);
  return;
}

Assistant:

LNodeEStmt(std::shared_ptr<LNode> vars, std::shared_ptr<LNode> expr) {
        this->vars = std::move(vars);
        this->expr = std::move(expr);
    }